

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O0

string * __thiscall pbrt::AtomicDouble::ToString_abi_cxx11_(AtomicDouble *this)

{
  string *in_RDI;
  double *unaff_retaddr;
  char *in_stack_00000008;
  
  operator_cast_to_double((AtomicDouble *)0x527c54);
  StringPrintf<double>(in_stack_00000008,unaff_retaddr);
  return in_RDI;
}

Assistant:

std::string AtomicDouble::ToString() const {
    return StringPrintf("%f", double(*this));
}